

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<double,double,int(*)(char_const**,double*)>
               (double num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  int iVar1;
  char *__s;
  double num2;
  char *mp_num_pos2;
  char str [256];
  char mp_nums [16] [16];
  double local_238;
  char *local_230;
  char local_228 [256];
  char local_128 [264];
  
  builtin_strncpy(local_228,"typed read of ",0xf);
  iVar1 = snprintf(local_228 + 0xe,0xf2,"%lf",0xeb851eb8);
  __s = local_228 + (long)iVar1 + 0xe;
  iVar1 = snprintf(__s,(size_t)(local_128 + -(long)__s)," into ");
  snprintf(__s + iVar1,(size_t)(local_128 + -(long)(__s + iVar1)),"double");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fputs(local_228,_stdout);
  fputc(10,_stdout);
  local_230 = local_128;
  local_128[0] = -0x35;
  local_128[1] = -0x40;
  local_128[2] = '\x16';
  local_128[3] = '8';
  local_128[4] = 'Q';
  local_128[5] = -0x15;
  local_128[6] = -0x7b;
  local_128[7] = '\x1e';
  local_128[8] = -0x48;
  local_238 = 0.0;
  iVar1 = (*read_f)(&local_230,&local_238);
  _ok((uint)(iVar1 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",0xffffffcb);
  _ok((uint)(local_128 + 9 == local_230),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  _ok((uint)(ABS(-5.555 - local_238) < 1e-15),"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  return;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}